

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool gflags::anon_unknown_2::TryParseLocked
               (CommandLineFlag *flag,FlagValue *flag_value,char *value,string *msg)

{
  bool bVar1;
  FlagValue *this;
  char *pcVar2;
  string local_48;
  
  this = FlagValue::New(flag_value);
  bVar1 = FlagValue::ParseFrom(this,value);
  if (bVar1) {
    bVar1 = CommandLineFlag::Validate(flag,this);
    if (bVar1) {
      FlagValue::CopyFrom(flag_value,this);
      if (msg != (string *)0x0) {
        pcVar2 = flag->name_;
        (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,flag_value);
        StringAppendF(msg,"%s set to %s\n",pcVar2,local_48._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_48);
      }
      FlagValue::~FlagValue(this);
      operator_delete(this);
      return true;
    }
    if (msg != (string *)0x0) {
      (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,this);
      StringAppendF(msg,"%sfailed validation of new value \'%s\' for flag \'%s\'\n","ERROR: ",
                    local_48._M_dataplus._M_p,flag->name_);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else if (msg != (string *)0x0) {
    pcVar2 = CommandLineFlag::type_name(flag);
    StringAppendF(msg,"%sillegal value \'%s\' specified for %s flag \'%s\'\n","ERROR: ",value,pcVar2
                  ,flag->name_);
  }
  FlagValue::~FlagValue(this);
  operator_delete(this);
  return false;
}

Assistant:

bool TryParseLocked(const CommandLineFlag* flag, FlagValue* flag_value,
                    const char* value, string* msg) {
  // Use tenative_value, not flag_value, until we know value is valid.
  FlagValue* tentative_value = flag_value->New();
  if (!tentative_value->ParseFrom(value)) {
    if (msg) {
      StringAppendF(msg,
                    "%sillegal value '%s' specified for %s flag '%s'\n",
                    kError, value,
                    flag->type_name(), flag->name());
    }
    delete tentative_value;
    return false;
  } else if (!flag->Validate(*tentative_value)) {
    if (msg) {
      StringAppendF(msg,
          "%sfailed validation of new value '%s' for flag '%s'\n",
          kError, tentative_value->ToString().c_str(),
          flag->name());
    }
    delete tentative_value;
    return false;
  } else {
    flag_value->CopyFrom(*tentative_value);
    if (msg) {
      StringAppendF(msg, "%s set to %s\n",
                    flag->name(), flag_value->ToString().c_str());
    }
    delete tentative_value;
    return true;
  }
}